

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.cpp
# Opt level: O1

size_t duckdb_zstd::ZSTD_decodeSeqHeaders(ZSTD_DCtx *dctx,int *nbSeqPtr,void *src,size_t srcSize)

{
  U32 *wksp;
  byte bVar1;
  byte *pbVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  byte *pbVar6;
  uint nbSeq;
  byte *pbVar7;
  bool bVar8;
  int in_stack_ffffffffffffffa0;
  
  sVar5 = 0xffffffffffffffb8;
  if (srcSize == 0) {
    return 0xffffffffffffffb8;
  }
  bVar1 = *src;
  nbSeq = (uint)bVar1;
  if ((char)bVar1 < '\0') {
    if (bVar1 == 0xff) {
      if ((long)srcSize < 3) {
        return 0xffffffffffffffb8;
      }
      pbVar2 = (byte *)((long)src + 3);
      nbSeq = *(ushort *)((long)src + 1) + 0x7f00;
    }
    else {
      if ((long)srcSize < 2) {
        return 0xffffffffffffffb8;
      }
      pbVar2 = (byte *)((long)src + 2);
      nbSeq = ((uint)bVar1 * 0x100 + (uint)*(byte *)((long)src + 1)) - 0x8000;
    }
  }
  else {
    pbVar2 = (byte *)((long)src + 1);
  }
  pbVar7 = (byte *)(srcSize + (long)src);
  *nbSeqPtr = nbSeq;
  if (nbSeq == 0) {
    sVar5 = 0xffffffffffffffec;
    if (pbVar2 == pbVar7) {
      sVar5 = (long)pbVar2 - (long)src;
    }
  }
  else {
    pbVar6 = pbVar2 + 1;
    if (pbVar6 <= pbVar7) {
      bVar1 = *pbVar2;
      sVar5 = 0xffffffffffffffec;
      if ((bVar1 & 3) == 0) {
        wksp = dctx->workspace;
        sVar3 = ZSTD_buildSeqTable((dctx->entropy).LLTable,&dctx->LLTptr,(uint)(bVar1 >> 6),0x23,9,
                                   pbVar6,(long)pbVar7 - (long)pbVar6,(U32 *)LL_base,LL_bits,
                                   (ZSTD_seqSymbol *)LL_defaultDTable,dctx->fseEntropy,
                                   dctx->ddictIsCold,nbSeq,wksp,(ulong)(uint)dctx->bmi2,
                                   in_stack_ffffffffffffffa0);
        bVar8 = false;
        sVar4 = 0;
        if (sVar3 < 0xffffffffffffff89) {
          sVar4 = sVar3;
        }
        pbVar6 = pbVar6 + sVar4;
        if (sVar3 < 0xffffffffffffff89) {
          sVar3 = ZSTD_buildSeqTable((dctx->entropy).OFTable,&dctx->OFTptr,bVar1 >> 4 & set_repeat,
                                     0x1f,8,pbVar6,(long)pbVar7 - (long)pbVar6,(U32 *)OF_base,
                                     OF_bits,(ZSTD_seqSymbol *)OF_defaultDTable,dctx->fseEntropy,
                                     dctx->ddictIsCold,nbSeq,wksp,(ulong)(uint)dctx->bmi2,
                                     in_stack_ffffffffffffffa0);
          bVar8 = false;
          sVar4 = 0;
          if (sVar3 < 0xffffffffffffff89) {
            sVar4 = sVar3;
          }
          pbVar6 = pbVar6 + sVar4;
          if (sVar3 < 0xffffffffffffff89) {
            sVar3 = ZSTD_buildSeqTable((dctx->entropy).MLTable,&dctx->MLTptr,bVar1 >> 2 & set_repeat
                                       ,0x34,9,pbVar6,(long)pbVar7 - (long)pbVar6,(U32 *)ML_base,
                                       ML_bits,(ZSTD_seqSymbol *)ML_defaultDTable,dctx->fseEntropy,
                                       dctx->ddictIsCold,nbSeq,wksp,(ulong)(uint)dctx->bmi2,
                                       in_stack_ffffffffffffffa0);
            bVar8 = sVar3 < 0xffffffffffffff89;
            sVar4 = 0;
            if (bVar8) {
              sVar4 = sVar3;
            }
            pbVar6 = pbVar6 + sVar4;
          }
        }
        if (bVar8) {
          sVar5 = (long)pbVar6 - (long)src;
        }
      }
    }
  }
  return sVar5;
}

Assistant:

size_t ZSTD_decodeSeqHeaders(ZSTD_DCtx* dctx, int* nbSeqPtr,
                             const void* src, size_t srcSize)
{
    const BYTE* const istart = (const BYTE*)src;
    const BYTE* const iend = istart + srcSize;
    const BYTE* ip = istart;
    int nbSeq;
    DEBUGLOG(5, "ZSTD_decodeSeqHeaders");

    /* check */
    RETURN_ERROR_IF(srcSize < MIN_SEQUENCES_SIZE, srcSize_wrong, "");

    /* SeqHead */
    nbSeq = *ip++;
    if (nbSeq > 0x7F) {
        if (nbSeq == 0xFF) {
            RETURN_ERROR_IF(ip+2 > iend, srcSize_wrong, "");
            nbSeq = MEM_readLE16(ip) + LONGNBSEQ;
            ip+=2;
        } else {
            RETURN_ERROR_IF(ip >= iend, srcSize_wrong, "");
            nbSeq = ((nbSeq-0x80)<<8) + *ip++;
        }
    }
    *nbSeqPtr = nbSeq;

    if (nbSeq == 0) {
        /* No sequence : section ends immediately */
        RETURN_ERROR_IF(ip != iend, corruption_detected,
            "extraneous data present in the Sequences section");
        return (size_t)(ip - istart);
    }

    /* FSE table descriptors */
    RETURN_ERROR_IF(ip+1 > iend, srcSize_wrong, ""); /* minimum possible size: 1 byte for symbol encoding types */
    RETURN_ERROR_IF(*ip & 3, corruption_detected, ""); /* The last field, Reserved, must be all-zeroes. */
    {   symbolEncodingType_e const LLtype = (symbolEncodingType_e)(*ip >> 6);
        symbolEncodingType_e const OFtype = (symbolEncodingType_e)((*ip >> 4) & 3);
        symbolEncodingType_e const MLtype = (symbolEncodingType_e)((*ip >> 2) & 3);
        ip++;

        /* Build DTables */
        {   size_t const llhSize = ZSTD_buildSeqTable(dctx->entropy.LLTable, &dctx->LLTptr,
                                                      LLtype, MaxLL, LLFSELog,
                                                      ip, iend-ip,
                                                      LL_base, LL_bits,
                                                      LL_defaultDTable, dctx->fseEntropy,
                                                      dctx->ddictIsCold, nbSeq,
                                                      dctx->workspace, sizeof(dctx->workspace),
                                                      ZSTD_DCtx_get_bmi2(dctx));
            RETURN_ERROR_IF(ZSTD_isError(llhSize), corruption_detected, "ZSTD_buildSeqTable failed");
            ip += llhSize;
        }

        {   size_t const ofhSize = ZSTD_buildSeqTable(dctx->entropy.OFTable, &dctx->OFTptr,
                                                      OFtype, MaxOff, OffFSELog,
                                                      ip, iend-ip,
                                                      OF_base, OF_bits,
                                                      OF_defaultDTable, dctx->fseEntropy,
                                                      dctx->ddictIsCold, nbSeq,
                                                      dctx->workspace, sizeof(dctx->workspace),
                                                      ZSTD_DCtx_get_bmi2(dctx));
            RETURN_ERROR_IF(ZSTD_isError(ofhSize), corruption_detected, "ZSTD_buildSeqTable failed");
            ip += ofhSize;
        }

        {   size_t const mlhSize = ZSTD_buildSeqTable(dctx->entropy.MLTable, &dctx->MLTptr,
                                                      MLtype, MaxML, MLFSELog,
                                                      ip, iend-ip,
                                                      ML_base, ML_bits,
                                                      ML_defaultDTable, dctx->fseEntropy,
                                                      dctx->ddictIsCold, nbSeq,
                                                      dctx->workspace, sizeof(dctx->workspace),
                                                      ZSTD_DCtx_get_bmi2(dctx));
            RETURN_ERROR_IF(ZSTD_isError(mlhSize), corruption_detected, "ZSTD_buildSeqTable failed");
            ip += mlhSize;
        }
    }

    return ip-istart;
}